

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O2

void __thiscall duckdb::TaskScheduler::RelaunchThreadsInternal(TaskScheduler *this,int32_t n)

{
  vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_true>
  *this_00;
  templated_unique_single_t __p;
  int iVar1;
  DBConfig *pDVar2;
  unsigned_long uVar3;
  pointer puVar4;
  reference this_01;
  type paVar5;
  reference this_02;
  pointer this_03;
  ulong uVar6;
  pointer puVar7;
  ulong n_00;
  idx_t i;
  long lVar8;
  bool bVar9;
  templated_unique_single_t thread_wrapper;
  unique_ptr<std::thread,_std::default_delete<std::thread>,_true> worker_thread;
  unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true> marker;
  tuple<std::atomic<bool>_*,_std::default_delete<std::atomic<bool>_>_> local_40;
  TaskScheduler *local_38;
  
  pDVar2 = DBConfig::GetConfig(this->db);
  uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert(n);
  this_00 = &this->threads;
  puVar4 = (this->threads).
           super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (this->threads).
           super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)puVar7 - (long)puVar4 >> 3;
  if (uVar6 == uVar3) {
    iVar1 = NumericCastImpl<int,_unsigned_long,_false>::Convert
                      (uVar3 + (pDVar2->options).external_threads);
    LOCK();
    (this->current_thread_count).super___atomic_base<int>._M_i = iVar1;
    UNLOCK();
  }
  else {
    if (uVar3 < uVar6) {
      for (uVar6 = 0; n_00 = (long)puVar7 - (long)puVar4 >> 3, uVar6 < n_00; uVar6 = uVar6 + 1) {
        this_01 = vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_true>
                  ::get<true>(&this->markers,uVar6);
        paVar5 = unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>::
                 operator*(this_01);
        LOCK();
        (paVar5->_M_base)._M_i = false;
        UNLOCK();
        puVar4 = (this->threads).
                 super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar7 = (this->threads).
                 super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      Signal(this,n_00);
      for (uVar6 = 0;
          uVar6 < (ulong)((long)(this->threads).
                                super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                                .
                                super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->threads).
                                super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                                .
                                super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1)
      {
        this_02 = vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_true>
                  ::get<true>(this_00,uVar6);
        this_03 = unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>
                  ::operator->(this_02);
        unique_ptr<std::thread,_std::default_delete<std::thread>,_true>::operator->
                  (&this_03->internal_thread);
        ::std::thread::join();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
      ::clear(&this_00->
               super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
             );
      ::std::
      vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
      ::clear(&(this->markers).
               super_vector<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>,_std::allocator<duckdb::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true>_>_>
             );
      uVar6 = (long)(this->threads).
                    super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->threads).
                    super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
    }
    lVar8 = uVar3 - uVar6;
    if (uVar6 <= uVar3 && lVar8 != 0) {
      while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
        marker.super_unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>_>._M_t.
        super___uniq_ptr_impl<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>_>._M_t.
        super__Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>_>_>.
        super__Head_base<0UL,_std::atomic<bool>_*,_false>._M_head_impl =
             (unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>_>)
             operator_new(1);
        worker_thread.super_unique_ptr<std::thread,_std::default_delete<std::thread>_>._M_t.
        super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
        super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
        super__Head_base<0UL,_std::thread_*,_false>._M_head_impl =
             (unique_ptr<std::thread,_std::default_delete<std::thread>_>)
             (__uniq_ptr_data<std::thread,_std::default_delete<std::thread>,_true,_true>)0x0;
        *(undefined1 *)
         marker.super_unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>_>._M_t.
         super___uniq_ptr_impl<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>_>._M_t.
         super__Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>_>_>.
         super__Head_base<0UL,_std::atomic<bool>_*,_false>._M_head_impl = 1;
        local_40.
        super__Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>_>_>.
        super__Head_base<0UL,_std::atomic<bool>_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>_>_>)
             (_Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>_>_>)
             marker.super_unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>_>.
             _M_t.super___uniq_ptr_impl<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>_>_>.
             super__Head_base<0UL,_std::atomic<bool>_*,_false>._M_head_impl;
        local_38 = this;
        make_uniq<std::thread,void(&)(duckdb::TaskScheduler*,std::atomic<bool>*),duckdb::TaskScheduler*,std::atomic<bool>*>
                  ((duckdb *)&thread_wrapper,ThreadExecuteTasks,&local_38,(atomic<bool> **)&local_40
                  );
        __p = thread_wrapper;
        thread_wrapper.
        super_unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::SchedulerThread_*,_std::default_delete<duckdb::SchedulerThread>_>
        .super__Head_base<0UL,_duckdb::SchedulerThread_*,_false>._M_head_impl =
             (unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>_>)
             (__uniq_ptr_data<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true,_true>
              )0x0;
        ::std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
                  ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)&worker_thread
                   ,(pointer)__p.
                             super_unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::SchedulerThread_*,_std::default_delete<duckdb::SchedulerThread>_>
                             .super__Head_base<0UL,_duckdb::SchedulerThread_*,_false>._M_head_impl);
        ::std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
                  ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&thread_wrapper);
        make_uniq<duckdb::SchedulerThread,duckdb::unique_ptr<std::thread,std::default_delete<std::thread>,true>>
                  ((duckdb *)&thread_wrapper,&worker_thread);
        ::std::
        vector<duckdb::unique_ptr<duckdb::SchedulerThread,std::default_delete<duckdb::SchedulerThread>,true>,std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,std::default_delete<duckdb::SchedulerThread>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::SchedulerThread,std::default_delete<duckdb::SchedulerThread>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::SchedulerThread,std::default_delete<duckdb::SchedulerThread>,true>,std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,std::default_delete<duckdb::SchedulerThread>,true>>>
                    *)this_00,&thread_wrapper);
        ::std::
        vector<duckdb::unique_ptr<std::atomic<bool>,std::default_delete<std::atomic<bool>>,true>,std::allocator<duckdb::unique_ptr<std::atomic<bool>,std::default_delete<std::atomic<bool>>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<std::atomic<bool>,std::default_delete<std::atomic<bool>>,true>>
                  ((vector<duckdb::unique_ptr<std::atomic<bool>,std::default_delete<std::atomic<bool>>,true>,std::allocator<duckdb::unique_ptr<std::atomic<bool>,std::default_delete<std::atomic<bool>>,true>>>
                    *)&this->markers,
                   (unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>,_true> *)
                   &marker.
                    super_unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>_>);
        ::std::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>_>::
        ~unique_ptr(&thread_wrapper.
                     super_unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>_>
                   );
        ::std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
                  ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&worker_thread);
        ::std::unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>_>::~unique_ptr
                  (&marker.
                    super_unique_ptr<std::atomic<bool>,_std::default_delete<std::atomic<bool>_>_>);
      }
    }
    iVar1 = NumericCastImpl<int,_unsigned_long,_false>::Convert
                      (((long)(this->threads).
                              super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->threads).
                              super_vector<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SchedulerThread,_std::default_delete<duckdb::SchedulerThread>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) +
                       (pDVar2->options).external_threads);
    LOCK();
    (this->current_thread_count).super___atomic_base<int>._M_i = iVar1;
    UNLOCK();
    bVar9 = Allocator::SupportsFlush();
    if (bVar9) {
      Allocator::FlushAll();
    }
  }
  return;
}

Assistant:

void TaskScheduler::RelaunchThreadsInternal(int32_t n) {
#ifndef DUCKDB_NO_THREADS
	auto &config = DBConfig::GetConfig(db);
	auto new_thread_count = NumericCast<idx_t>(n);
	if (threads.size() == new_thread_count) {
		current_thread_count = NumericCast<int32_t>(threads.size() + config.options.external_threads);
		return;
	}
	if (threads.size() > new_thread_count) {
		// we are reducing the number of threads: clear all threads first
		for (idx_t i = 0; i < threads.size(); i++) {
			*markers[i] = false;
		}
		Signal(threads.size());
		// now join the threads to ensure they are fully stopped before erasing them
		for (idx_t i = 0; i < threads.size(); i++) {
			threads[i]->internal_thread->join();
		}
		// erase the threads/markers
		threads.clear();
		markers.clear();
	}
	if (threads.size() < new_thread_count) {
		// we are increasing the number of threads: launch them and run tasks on them
		idx_t create_new_threads = new_thread_count - threads.size();
		for (idx_t i = 0; i < create_new_threads; i++) {
			// launch a thread and assign it a cancellation marker
			auto marker = unique_ptr<atomic<bool>>(new atomic<bool>(true));
			unique_ptr<thread> worker_thread;
			try {
				worker_thread = make_uniq<thread>(ThreadExecuteTasks, this, marker.get());
			} catch (std::exception &ex) {
				// thread constructor failed - this can happen when the system has too many threads allocated
				// in this case we cannot allocate more threads - stop launching them
				break;
			}
			auto thread_wrapper = make_uniq<SchedulerThread>(std::move(worker_thread));

			threads.push_back(std::move(thread_wrapper));
			markers.push_back(std::move(marker));
		}
	}
	current_thread_count = NumericCast<int32_t>(threads.size() + config.options.external_threads);
	if (Allocator::SupportsFlush()) {
		Allocator::FlushAll();
	}
#endif
}